

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setImageLimited<unsigned_short>
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *a)

{
  int j;
  long lVar1;
  long k;
  long lVar2;
  long i;
  long lVar3;
  ushort uVar4;
  
  setSize(this,a->width,a->height,(long)a->depth);
  for (lVar1 = 0; lVar1 < this->depth; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 < this->height; lVar2 = lVar2 + 1) {
      for (lVar3 = 0; lVar3 < this->width; lVar3 = lVar3 + 1) {
        uVar4 = a->img[lVar1][lVar2][lVar3];
        if (0xfe < uVar4) {
          uVar4 = 0xff;
        }
        this->img[lVar1][lVar2][lVar3] = (uchar)uVar4;
      }
    }
  }
  return;
}

Assistant:

void setImageLimited(const Image<S> &a)
    {
      setSize(a.getWidth(), a.getHeight(), a.getDepth());

      for (int j=0; j<depth; j++)
        for (long k=0; k<height; k++)
          for (long i=0; i<width; i++)
          {
            img[j][k][i]=ptraits::limit(static_cast<work_t>(a.get(i, k, j)));
          }
    }